

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O2

void Cmd_dumpgeometry(FCommandLine *argv,APlayerPawn *who,int key)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  subsector_t *psVar5;
  seg_t *psVar6;
  long lVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  sector_t *psVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  BYTE *pBVar14;
  DWORD k;
  ulong uVar15;
  long lVar16;
  
  for (lVar13 = 0; psVar10 = sectors, lVar13 < numsectors; lVar13 = lVar13 + 1) {
    Printf(5,"Sector %d\n");
    for (lVar12 = 0; lVar12 < psVar10[lVar13].subsectorcount; lVar12 = lVar12 + 1) {
      psVar5 = psVar10[lVar13].subsectors[lVar12];
      pBVar14 = "hacked";
      if ((psVar5->hacked & 1U) == 0) {
        pBVar14 = "";
      }
      Printf(5,"    Subsector %d - real sector = %d - %s\n",
             ((long)psVar5 - (long)subsectors) / 0x60 & 0xffffffff,
             (ulong)(uint)psVar5->sector->sectornum,pBVar14);
      lVar16 = 0;
      for (uVar15 = 0; uVar15 < psVar5->numlines; uVar15 = uVar15 + 1) {
        psVar6 = psVar5->firstline;
        lVar7 = *(long *)((long)&psVar6->linedef + lVar16);
        uVar11 = ((long)psVar6 + (lVar16 - (long)segs)) / 0x48;
        puVar8 = *(undefined8 **)((long)&psVar6->v1 + lVar16);
        puVar9 = *(undefined8 **)((long)&psVar6->v2 + lVar16);
        uVar1 = *puVar8;
        uVar2 = puVar8[1];
        uVar3 = *puVar9;
        uVar4 = puVar9[1];
        if (lVar7 == 0) {
          Printf(5,"      (%4.4f, %4.4f), (%4.4f, %4.4f) - seg %d, miniseg",uVar1,uVar2,uVar3,uVar4,
                 uVar11 & 0xffffffff);
        }
        else {
          Printf(5,"      (%4.4f, %4.4f), (%4.4f, %4.4f) - seg %d, linedef %d, side %d",uVar1,uVar2,
                 uVar3,uVar4,uVar11 & 0xffffffff,(lVar7 - (long)lines) / 0x98 & 0xffffffff,
                 (ulong)(*(long *)((long)&psVar6->sidedef + lVar16) != *(long *)(lVar7 + 0x48)));
        }
        lVar7 = *(long *)((long)&psVar6->PartnerSeg + lVar16);
        if (lVar7 == 0) {
          lVar7 = *(long *)((long)&psVar6->backsector + lVar16);
          if (lVar7 != 0) {
            Printf(5,", back sector = %d (no partnerseg)",(ulong)*(uint *)(lVar7 + 0x1fc));
          }
        }
        else {
          Printf(5,", back sector = %d, real back sector = %d",
                 (ulong)*(uint *)(*(long *)(*(long *)(lVar7 + 0x38) + 0x20) + 0x1fc),
                 (ulong)*(uint *)(*(long *)(lVar7 + 0x20) + 0x1fc));
        }
        Printf(5,"\n");
        lVar16 = lVar16 + 0x48;
      }
    }
  }
  return;
}

Assistant:

CCMD(dumpgeometry)
{
	for(int i=0;i<numsectors;i++)
	{
		sector_t * sector = &sectors[i];

		Printf(PRINT_LOG, "Sector %d\n",i);
		for(int j=0;j<sector->subsectorcount;j++)
		{
			subsector_t * sub = sector->subsectors[j];

			Printf(PRINT_LOG, "    Subsector %d - real sector = %d - %s\n", int(sub-subsectors), sub->sector->sectornum, sub->hacked&1? "hacked":"");
			for(DWORD k=0;k<sub->numlines;k++)
			{
				seg_t * seg = sub->firstline + k;
				if (seg->linedef)
				{
				Printf(PRINT_LOG, "      (%4.4f, %4.4f), (%4.4f, %4.4f) - seg %d, linedef %d, side %d", 
					seg->v1->fX(), seg->v1->fY(), seg->v2->fX(), seg->v2->fY(),
					int(seg-segs), int(seg->linedef-lines), seg->sidedef != seg->linedef->sidedef[0]);
				}
				else
				{
					Printf(PRINT_LOG, "      (%4.4f, %4.4f), (%4.4f, %4.4f) - seg %d, miniseg", 
						seg->v1->fX(), seg->v1->fY(), seg->v2->fX(), seg->v2->fY(),
						int(seg-segs));
				}
				if (seg->PartnerSeg) 
				{
					subsector_t * sub2 = seg->PartnerSeg->Subsector;
					Printf(PRINT_LOG, ", back sector = %d, real back sector = %d", sub2->render_sector->sectornum, seg->PartnerSeg->frontsector->sectornum);
				}
				else if (seg->backsector)
				{
					Printf(PRINT_LOG, ", back sector = %d (no partnerseg)", seg->backsector->sectornum);
				}

				Printf(PRINT_LOG, "\n");
			}
		}
	}
}